

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

PromiseFulfillerPair<kj::HttpClient::Response> *
kj::newPromiseAndFulfiller<kj::HttpClient::Response>(SourceLocation location)

{
  SourceLocation location_00;
  RefOrVoid<kj::_::WeakFulfiller<kj::HttpClient::Response>_> params;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *node;
  Response *pRVar1;
  OwnPromiseNode *node_00;
  Promise<kj::HttpClient::Response> *pPVar2;
  Own<kj::_::WeakFulfiller<kj::HttpClient::Response>,_std::nullptr_t> *other;
  PromiseFulfillerPair<kj::HttpClient::Response> *in_RDI;
  undefined8 in_stack_00000008;
  void *local_50;
  Promise<kj::HttpClient::Response> promise;
  Own<kj::_::AdapterPromiseNode<kj::HttpClient::Response,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::Response>_>,_kj::_::PromiseDisposer>
  local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  OwnPromiseNode intermediate;
  Own<kj::_::WeakFulfiller<kj::HttpClient::Response>,_std::nullptr_t> wrapper;
  
  _::WeakFulfiller<kj::HttpClient::Response>::make();
  params = Own<kj::_::WeakFulfiller<kj::HttpClient::Response>,_std::nullptr_t>::operator*
                     ((Own<kj::_::WeakFulfiller<kj::HttpClient::Response>,_std::nullptr_t> *)
                      &intermediate);
  _::
  allocPromise<kj::_::AdapterPromiseNode<kj::HttpClient::Response,kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::Response>>,kj::_::WeakFulfiller<kj::HttpClient::Response>&>
            ((_ *)&local_30,params);
  Own<kj::_::PromiseNode,kj::_::PromiseDisposer>::
  Own<kj::_::AdapterPromiseNode<kj::HttpClient::Response,kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::Response>>,void>
            ((Own<kj::_::PromiseNode,kj::_::PromiseDisposer> *)&local_28,&local_30);
  Own<kj::_::AdapterPromiseNode<kj::HttpClient::Response,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::Response>_>,_kj::_::PromiseDisposer>
  ::~Own(&local_30);
  node = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(&local_28);
  local_50 = (void *)0x0;
  pRVar1 = implicitCast<kj::HttpClient::Response*,decltype(nullptr)>(&local_50);
  unique0x10000217 = location;
  location_00.fileName = (char *)in_stack_00000008;
  location_00._16_8_ = location.function;
  node_00 = _::maybeChain<kj::HttpClient::Response>(node,pRVar1,location_00);
  _::PromiseNode::to<kj::Promise<kj::HttpClient::Response>>
            ((PromiseNode *)&stack0xffffffffffffffb8,node_00);
  pPVar2 = mv<kj::Promise<kj::HttpClient::Response>>
                     ((Promise<kj::HttpClient::Response> *)&stack0xffffffffffffffb8);
  Promise<kj::HttpClient::Response>::Promise(&in_RDI->promise,pPVar2);
  other = mv<kj::Own<kj::_::WeakFulfiller<kj::HttpClient::Response>,decltype(nullptr)>>
                    ((Own<kj::_::WeakFulfiller<kj::HttpClient::Response>,_std::nullptr_t> *)
                     &intermediate);
  Own<kj::PromiseFulfiller<kj::HttpClient::Response>,decltype(nullptr)>::
  Own<kj::_::WeakFulfiller<kj::HttpClient::Response>,void>
            ((Own<kj::PromiseFulfiller<kj::HttpClient::Response>,decltype(nullptr)> *)
             &in_RDI->fulfiller,other);
  Promise<kj::HttpClient::Response>::~Promise
            ((Promise<kj::HttpClient::Response> *)&stack0xffffffffffffffb8);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own(&local_28);
  Own<kj::_::WeakFulfiller<kj::HttpClient::Response>,_std::nullptr_t>::~Own
            ((Own<kj::_::WeakFulfiller<kj::HttpClient::Response>,_std::nullptr_t> *)&intermediate);
  return in_RDI;
}

Assistant:

PromiseFulfillerPair<T> newPromiseAndFulfiller(SourceLocation location) {
  auto wrapper = _::WeakFulfiller<T>::make();

  _::OwnPromiseNode intermediate(
      _::allocPromise<_::AdapterPromiseNode<
          _::FixVoid<T>, _::PromiseAndFulfillerAdapter<T>>>(*wrapper));
  auto promise = _::PromiseNode::to<_::ReducePromises<T>>(
      _::maybeChain(kj::mv(intermediate), implicitCast<T*>(nullptr), location));

  return PromiseFulfillerPair<T> { kj::mv(promise), kj::mv(wrapper) };
}